

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

CURLcode Curl_http_input_auth(Curl_easy *data,_Bool proxy,char *auth)

{
  undefined1 *puVar1;
  char *pcVar2;
  long lVar3;
  unsigned_long *puVar4;
  byte bVar5;
  char cVar6;
  curl_trc_feat *pcVar7;
  _Bool _Var8;
  int iVar9;
  CURLcode CVar10;
  
  if (*auth != '\0') {
    lVar3 = (ulong)!proxy * 8;
    do {
      iVar9 = curl_strnequal(auth,"NTLM",4);
      if (iVar9 == 0) {
LAB_0013452e:
        iVar9 = curl_strnequal(auth,"Digest",6);
        if (iVar9 != 0) {
          bVar5 = auth[6];
          if ((((ulong)bVar5 < 0x2d) && ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
             (0xfb < (byte)(bVar5 - 0xe))) {
            if (((&(data->state).authhost)[proxy].avail & 2) == 0) {
              _Var8 = Curl_auth_is_digest_supported();
              if (_Var8) {
                pcVar2 = (data->info).primary.remote_ip + lVar3 + -0x34;
                *pcVar2 = *pcVar2 | 2;
                puVar4 = &(&(data->state).authhost)[proxy].avail;
                *(byte *)puVar4 = (byte)*puVar4 | 2;
                CVar10 = Curl_input_digest(data,proxy,auth);
                if (CVar10 != CURLE_OK) goto LAB_00134672;
              }
            }
            else if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
                    ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 ||
                     (0 < pcVar7->log_level)))) {
              Curl_infof(data,"Ignoring duplicate digest auth header.");
            }
            goto LAB_001346b9;
          }
        }
        iVar9 = curl_strnequal(auth,"Basic",5);
        if (iVar9 != 0) {
          bVar5 = auth[5];
          if (((0x2c < (ulong)bVar5) || ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) &&
             ((byte)(bVar5 - 0xe) < 0xfc)) goto LAB_0013462e;
          pcVar2 = (data->info).primary.remote_ip + lVar3 + -0x34;
          *pcVar2 = *pcVar2 | 1;
          puVar4 = &(&(data->state).authhost)[proxy].avail;
          *(byte *)puVar4 = (byte)*puVar4 | 1;
          if ((&(data->state).authhost)[proxy].picked != 1) goto LAB_001346b9;
LAB_00134669:
          (&(data->state).authhost)[proxy].avail = 0;
          goto LAB_00134672;
        }
LAB_0013462e:
        iVar9 = curl_strnequal(auth,"Bearer",6);
        if (iVar9 != 0) {
          bVar5 = auth[6];
          if ((((ulong)bVar5 < 0x2d) && ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) ||
             (0xfb < (byte)(bVar5 - 0xe))) {
            pcVar2 = (data->info).primary.remote_ip + lVar3 + -0x34;
            *pcVar2 = *pcVar2 | 0x40;
            puVar4 = &(&(data->state).authhost)[proxy].avail;
            *(byte *)puVar4 = (byte)*puVar4 | 0x40;
            if ((&(data->state).authhost)[proxy].picked == 0x40) goto LAB_00134669;
          }
        }
      }
      else {
        bVar5 = auth[4];
        if (((0x2c < (ulong)bVar5) || ((0x100100000201U >> ((ulong)bVar5 & 0x3f) & 1) == 0)) &&
           ((byte)(bVar5 - 0xe) < 0xfc)) goto LAB_0013452e;
        if ((((&(data->state).authhost)[proxy].avail & 8) == 0) &&
           (_Var8 = Curl_auth_is_ntlm_supported(), !_Var8)) goto LAB_001346b9;
        pcVar2 = (data->info).primary.remote_ip + lVar3 + -0x34;
        *pcVar2 = *pcVar2 | 8;
        puVar4 = &(&(data->state).authhost)[proxy].avail;
        *(byte *)puVar4 = (byte)*puVar4 | 8;
        if ((&(data->state).authhost)[proxy].picked != 8) goto LAB_001346b9;
        CVar10 = Curl_input_ntlm(data,proxy,auth);
        if (CVar10 == CURLE_OK) {
          puVar1 = &(data->state).field_0x774;
          *puVar1 = *puVar1 & 0xdf;
          goto LAB_001346b9;
        }
LAB_00134672:
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar7 = (data->state).feat, pcVar7 == (curl_trc_feat *)0x0 || (0 < pcVar7->log_level))
           )) {
          Curl_infof(data,"Authentication problem. Ignoring this.");
        }
        puVar1 = &(data->state).field_0x774;
        *puVar1 = *puVar1 | 0x20;
      }
LAB_001346b9:
      for (; (cVar6 = *auth, cVar6 != '\0' && (cVar6 != ',')); auth = auth + 1) {
      }
      for (auth = auth + (cVar6 == ',');
          ((cVar6 = *auth, cVar6 == '\t' || (cVar6 == ' ')) ||
          ((cVar6 != '\0' && ((byte)(cVar6 - 10U) < 4)))); auth = auth + 1) {
      }
    } while (*auth != '\0');
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_http_input_auth(struct Curl_easy *data, bool proxy,
                              const char *auth) /* the first non-space */
{
  /*
   * This resource requires authentication
   */
  struct connectdata *conn = data->conn;
#ifdef USE_SPNEGO
  curlnegotiate *negstate = proxy ? &conn->proxy_negotiate_state :
                                    &conn->http_negotiate_state;
#endif
#if defined(USE_SPNEGO) || \
  defined(USE_NTLM) || \
  !defined(CURL_DISABLE_DIGEST_AUTH) || \
  !defined(CURL_DISABLE_BASIC_AUTH) || \
  !defined(CURL_DISABLE_BEARER_AUTH)

  unsigned long *availp;
  struct auth *authp;

  if(proxy) {
    availp = &data->info.proxyauthavail;
    authp = &data->state.authproxy;
  }
  else {
    availp = &data->info.httpauthavail;
    authp = &data->state.authhost;
  }
#else
  (void) proxy;
#endif

  (void) conn; /* In case conditionals make it unused. */

  /*
   * Here we check if we want the specific single authentication (using ==) and
   * if we do, we initiate usage of it.
   *
   * If the provided authentication is wanted as one out of several accepted
   * types (using &), we OR this authentication type to the authavail
   * variable.
   *
   * Note:
   *
   * ->picked is first set to the 'want' value (one or more bits) before the
   * request is sent, and then it is again set _after_ all response 401/407
   * headers have been received but then only to a single preferred method
   * (bit).
   */

  while(*auth) {
#ifdef USE_SPNEGO
    if(checkprefix("Negotiate", auth) && is_valid_auth_separator(auth[9])) {
      if((authp->avail & CURLAUTH_NEGOTIATE) ||
         Curl_auth_is_spnego_supported()) {
        *availp |= CURLAUTH_NEGOTIATE;
        authp->avail |= CURLAUTH_NEGOTIATE;

        if(authp->picked == CURLAUTH_NEGOTIATE) {
          CURLcode result = Curl_input_negotiate(data, conn, proxy, auth);
          if(!result) {
            free(data->req.newurl);
            data->req.newurl = strdup(data->state.url);
            if(!data->req.newurl)
              return CURLE_OUT_OF_MEMORY;
            data->state.authproblem = FALSE;
            /* we received a GSS auth token and we dealt with it fine */
            *negstate = GSS_AUTHRECV;
          }
          else
            data->state.authproblem = TRUE;
        }
      }
    }
    else
#endif
#ifdef USE_NTLM
      /* NTLM support requires the SSL crypto libs */
      if(checkprefix("NTLM", auth) && is_valid_auth_separator(auth[4])) {
        if((authp->avail & CURLAUTH_NTLM) ||
           Curl_auth_is_ntlm_supported()) {
          *availp |= CURLAUTH_NTLM;
          authp->avail |= CURLAUTH_NTLM;

          if(authp->picked == CURLAUTH_NTLM) {
            /* NTLM authentication is picked and activated */
            CURLcode result = Curl_input_ntlm(data, proxy, auth);
            if(!result) {
              data->state.authproblem = FALSE;
            }
            else {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
      }
      else
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
        if(checkprefix("Digest", auth) && is_valid_auth_separator(auth[6])) {
          if((authp->avail & CURLAUTH_DIGEST) != 0)
            infof(data, "Ignoring duplicate digest auth header.");
          else if(Curl_auth_is_digest_supported()) {
            CURLcode result;

            *availp |= CURLAUTH_DIGEST;
            authp->avail |= CURLAUTH_DIGEST;

            /* We call this function on input Digest headers even if Digest
             * authentication is not activated yet, as we need to store the
             * incoming data from this header in case we are going to use
             * Digest */
            result = Curl_input_digest(data, proxy, auth);
            if(result) {
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
        }
        else
#endif
#ifndef CURL_DISABLE_BASIC_AUTH
          if(checkprefix("Basic", auth) &&
             is_valid_auth_separator(auth[5])) {
            *availp |= CURLAUTH_BASIC;
            authp->avail |= CURLAUTH_BASIC;
            if(authp->picked == CURLAUTH_BASIC) {
              /* We asked for Basic authentication but got a 40X back
                 anyway, which basically means our name+password is not
                 valid. */
              authp->avail = CURLAUTH_NONE;
              infof(data, "Authentication problem. Ignoring this.");
              data->state.authproblem = TRUE;
            }
          }
          else
#endif
#ifndef CURL_DISABLE_BEARER_AUTH
            if(checkprefix("Bearer", auth) &&
               is_valid_auth_separator(auth[6])) {
              *availp |= CURLAUTH_BEARER;
              authp->avail |= CURLAUTH_BEARER;
              if(authp->picked == CURLAUTH_BEARER) {
                /* We asked for Bearer authentication but got a 40X back
                  anyway, which basically means our token is not valid. */
                authp->avail = CURLAUTH_NONE;
                infof(data, "Authentication problem. Ignoring this.");
                data->state.authproblem = TRUE;
              }
            }
#else
            {
              /*
               * Empty block to terminate the if-else chain correctly.
               *
               * A semicolon would yield the same result here, but can cause a
               * compiler warning when -Wextra is enabled.
               */
            }
#endif

    /* there may be multiple methods on one line, so keep reading */
    while(*auth && *auth != ',') /* read up to the next comma */
      auth++;
    if(*auth == ',') /* if we are on a comma, skip it */
      auth++;
    while(*auth && ISSPACE(*auth))
      auth++;
  }

  return CURLE_OK;
}